

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O2

void __thiscall ON_SimpleArray<void_*>::Append(ON_SimpleArray<void_*> *this,void **x)

{
  void *pvVar1;
  int iVar2;
  void **ppvVar3;
  long lVar4;
  
  iVar2 = *(int *)(this + 0x10);
  ppvVar3 = x;
  if (iVar2 == *(int *)(this + 0x14)) {
    iVar2 = NewCapacity(this);
    if ((*(void ***)(this + 8) <= x) && (x < *(void ***)(this + 8) + *(int *)(this + 0x14))) {
      ppvVar3 = (void **)onmalloc(8);
      *ppvVar3 = *x;
    }
    Reserve(this,(long)iVar2);
    lVar4 = *(long *)(this + 8);
    if (lVar4 == 0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_array_defs.h"
                 ,0x1f0,"","allocation failure");
      return;
    }
    iVar2 = *(int *)(this + 0x10);
  }
  else {
    lVar4 = *(long *)(this + 8);
  }
  pvVar1 = *ppvVar3;
  *(int *)(this + 0x10) = iVar2 + 1;
  *(void **)(lVar4 + (long)iVar2 * 8) = pvVar1;
  if (ppvVar3 != x) {
    onfree(ppvVar3);
    return;
  }
  return;
}

Assistant:

void ON_SimpleArray<T>::Append( const T& x ) 
{
  const T* p = &x;
  if ( m_count == m_capacity ) 
  {
    const int newcapacity = NewCapacity();
    if ( p >= m_a && p < (m_a + m_capacity) )
    {
      // 26 Sep 2005 Dale Lear
      // x is in the block of memory about to be reallocated.
      void* temp = onmalloc(sizeof(T));
      memcpy(temp, (void*)p, sizeof(T));
      p = (T*)temp;
    }
    Reserve(newcapacity);
    if (nullptr == m_a)
    {
      ON_ERROR("allocation failure");
      return;
    }
  }
  m_a[m_count++] = *p;
  if (p != &x)
    onfree((void*)p);
}